

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint _h;
  _func_int *p_Var13;
  int *piVar14;
  void *pvVar15;
  Allocator *pAVar16;
  size_t sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  Layer *pLVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  undefined4 *puVar39;
  undefined4 *puVar40;
  long lVar41;
  long lVar42;
  Mat *this_01;
  long lVar43;
  uint _w;
  long lVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  ParamDict pd;
  long local_120;
  long local_108;
  uint local_f0;
  long local_d0;
  long local_c8;
  Mat local_c0;
  Option *local_78;
  long local_70;
  void *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar25 = create_layer(0xe);
  this->flatten = pLVar25;
  ParamDict::ParamDict((ParamDict *)&local_c0);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_c0);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_c0);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar24 = cpu_support_x86_f16c();
  if ((iVar24 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var13 = this->_vptr_InnerProduct_x86_avx[-3];
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var13);
  _h = *(uint *)(&this->field_0xd0 + (long)p_Var13);
  iVar24 = *(int *)(&this->field_0xd8 + (long)p_Var13);
  _w = iVar24 / (int)_h;
  this_00 = &this->weight_data_tm;
  local_78 = opt;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      Mat::reshape(&local_c0,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      if (7 < (int)_h) {
        lVar29 = 1;
        lVar32 = 2;
        lVar43 = 7;
        lVar30 = 5;
        lVar28 = 4;
        local_c8 = 3;
        local_d0 = 0;
        lVar41 = 6;
        uVar37 = 0;
        do {
          local_38 = lVar41;
          lVar41 = (long)(this->weight_data_tm).w;
          pvVar15 = (this->weight_data_tm).data;
          sVar17 = (this->weight_data_tm).elemsize;
          puVar39 = (undefined4 *)((uVar37 >> 3) * lVar41 * sVar17 + (long)pvVar15);
          lVar42 = (long)local_c0.w;
          if ((int)_w < 8) {
            lVar42 = local_c0.elemsize * lVar42;
            lVar41 = lVar42 * uVar37;
            lVar36 = (uVar37 | 1) * lVar42;
            lVar26 = (uVar37 | 2) * lVar42;
            lVar31 = (uVar37 | 3) * lVar42;
            lVar35 = (uVar37 | 4) * lVar42;
            lVar34 = (uVar37 | 5) * lVar42;
            lVar27 = (uVar37 | 6) * lVar42;
            lVar44 = lVar42 * (uVar37 | 7);
            uVar33 = 0;
          }
          else {
            lVar41 = sVar17 * local_d0 * lVar41;
            local_58 = local_c0.elemsize * uVar37 * lVar42;
            local_60 = local_c0.elemsize * lVar29 * lVar42;
            lVar26 = local_c0.elemsize * lVar32 * lVar42;
            local_70 = local_c0.elemsize * lVar43 * lVar42;
            lVar27 = local_c0.elemsize * local_38 * lVar42;
            lVar34 = local_c0.elemsize * lVar30 * lVar42;
            lVar35 = local_c0.elemsize * lVar28 * lVar42;
            lVar42 = local_c0.elemsize * local_c8 * lVar42;
            local_68 = local_c0.data;
            iVar24 = 7;
            lVar31 = 0;
            do {
              auVar5 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + local_58);
              auVar6 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + local_60);
              auVar7 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + lVar26);
              auVar8 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + lVar42);
              auVar9 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + lVar35);
              auVar10 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + lVar34);
              auVar11 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + lVar27);
              auVar12 = *(undefined1 (*) [32])((long)local_c0.data + lVar31 + local_70);
              auVar21 = vunpcklps_avx(auVar5,auVar6);
              auVar6 = vunpckhps_avx(auVar5,auVar6);
              auVar5 = vunpcklps_avx(auVar7,auVar8);
              auVar7 = vunpckhps_avx(auVar7,auVar8);
              auVar45 = vunpcklps_avx(auVar9,auVar10);
              auVar8 = vunpckhps_avx(auVar9,auVar10);
              auVar46 = vunpcklps_avx(auVar11,auVar12);
              auVar9 = vunpckhps_avx(auVar11,auVar12);
              auVar10 = vunpcklpd_avx(auVar21,auVar5);
              auVar5 = vunpckhpd_avx(auVar21,auVar5);
              auVar11 = vunpcklpd_avx(auVar6,auVar7);
              auVar6 = vunpckhpd_avx(auVar6,auVar7);
              auVar12 = vunpcklpd_avx(auVar45,auVar46);
              auVar7 = vunpckhpd_avx(auVar45,auVar46);
              auVar21 = vunpcklpd_avx(auVar8,auVar9);
              auVar8 = vunpckhpd_avx(auVar8,auVar9);
              auVar45._16_16_ = auVar12._0_16_;
              auVar45._0_16_ = auVar10._0_16_;
              auVar46._16_16_ = auVar7._0_16_;
              auVar46._0_16_ = auVar5._0_16_;
              auVar47._16_16_ = auVar21._0_16_;
              auVar47._0_16_ = auVar11._0_16_;
              auVar48._16_16_ = auVar8._0_16_;
              auVar48._0_16_ = auVar6._0_16_;
              auVar9 = vperm2f128_avx(auVar10,auVar12,0x31);
              auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
              auVar7 = vperm2f128_avx(auVar11,auVar21,0x31);
              auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41) = auVar45;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0x20) = auVar46;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0x40) = auVar47;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0x60) = auVar48;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0x80) = auVar9;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0xa0) = auVar5;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0xc0) = auVar7;
              *(undefined1 (*) [32])((long)pvVar15 + lVar31 * 8 + lVar41 + 0xe0) = auVar6;
              puVar39 = puVar39 + 0x40;
              lVar31 = lVar31 + 0x20;
              iVar24 = iVar24 + 8;
            } while (iVar24 < (int)_w);
            lVar41 = local_58 + lVar31;
            lVar36 = local_60 + lVar31;
            lVar26 = lVar26 + lVar31;
            lVar44 = local_70 + lVar31;
            lVar27 = lVar27 + lVar31;
            lVar34 = lVar34 + lVar31;
            lVar35 = lVar35 + lVar31;
            lVar31 = lVar42 + lVar31;
            uVar33 = _w & 0xfffffff8;
            local_50 = uVar37;
            local_48 = lVar30;
            local_40 = lVar29;
          }
          if ((int)uVar33 < (int)_w) {
            lVar42 = 0;
            do {
              *puVar39 = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar41);
              puVar39[1] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar36);
              puVar39[2] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar26);
              puVar39[3] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar31);
              puVar39[4] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar35);
              puVar39[5] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar34);
              puVar39[6] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar27);
              puVar39[7] = *(undefined4 *)((long)local_c0.data + lVar42 * 4 + lVar44);
              puVar39 = puVar39 + 8;
              lVar42 = lVar42 + 1;
            } while (_w - uVar33 != (int)lVar42);
          }
          uVar38 = uVar37 + 0xf;
          local_d0 = local_d0 + 1;
          lVar29 = lVar29 + 8;
          lVar32 = lVar32 + 8;
          lVar43 = lVar43 + 8;
          lVar30 = lVar30 + 8;
          lVar28 = lVar28 + 8;
          local_c8 = local_c8 + 8;
          lVar41 = local_38 + 8;
          uVar37 = uVar37 + 8;
        } while (uVar38 < _h);
      }
      if (local_c0.refcount == (int *)0x0) goto LAB_002e6a57;
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) goto LAB_002e6a57;
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        goto LAB_002e6a57;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002e625b;
      Mat::reshape(&local_c0,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        local_f0 = _w & 0xfffffffc;
        lVar43 = 3;
        lVar41 = 2;
        local_108 = 1;
        local_120 = 0;
        uVar37 = 0;
        do {
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar15 = (this->weight_data_tm).data;
          sVar17 = (this->weight_data_tm).elemsize;
          puVar39 = (undefined4 *)((uVar37 >> 2) * lVar30 * sVar17 + (long)pvVar15);
          lVar29 = (long)local_c0.w;
          if ((int)_w < 4) {
            lVar29 = local_c0.elemsize * lVar29;
            lVar36 = lVar29 * uVar37;
            lVar42 = (uVar37 | 1) * lVar29;
            lVar32 = (uVar37 | 2) * lVar29;
            lVar28 = lVar29 * (uVar37 | 3);
            uVar33 = 0;
          }
          else {
            lVar28 = local_c0.elemsize * lVar43 * lVar29;
            lVar32 = local_c0.elemsize * lVar41 * lVar29;
            lVar42 = local_c0.elemsize * local_108 * lVar29;
            lVar29 = local_c0.elemsize * uVar37 * lVar29;
            iVar24 = 3;
            lVar36 = 0;
            do {
              puVar40 = puVar39;
              auVar1 = *(undefined1 (*) [16])((long)local_c0.data + lVar36 + lVar29);
              auVar2 = *(undefined1 (*) [16])((long)local_c0.data + lVar36 + lVar42);
              auVar3 = *(undefined1 (*) [16])((long)local_c0.data + lVar36 + lVar32);
              auVar4 = *(undefined1 (*) [16])((long)local_c0.data + lVar36 + lVar28);
              auVar19 = vunpcklps_avx(auVar1,auVar2);
              auVar20 = vunpcklps_avx(auVar3,auVar4);
              auVar18 = vunpckhps_avx(auVar1,auVar2);
              auVar4 = vunpckhps_avx(auVar3,auVar4);
              auVar1 = vmovlhps_avx(auVar19,auVar20);
              auVar3 = vunpckhpd_avx(auVar19,auVar20);
              auVar2 = vmovlhps_avx(auVar18,auVar4);
              auVar4 = vunpckhpd_avx(auVar18,auVar4);
              puVar39 = (undefined4 *)
                        ((long)pvVar15 + lVar36 * 4 + sVar17 * local_120 * lVar30 + 0x40);
              *(undefined1 (*) [16])(puVar39 + -0x10) = auVar1;
              *(undefined1 (*) [16])(puVar39 + -0xc) = auVar3;
              *(undefined1 (*) [16])(puVar39 + -8) = auVar2;
              *(undefined1 (*) [16])(puVar39 + -4) = auVar4;
              iVar24 = iVar24 + 4;
              lVar36 = lVar36 + 0x10;
            } while (iVar24 < (int)_w);
            puVar39 = puVar40 + 0x10;
            lVar28 = lVar28 + lVar36;
            lVar32 = lVar32 + lVar36;
            lVar42 = lVar42 + lVar36;
            lVar36 = lVar29 + lVar36;
            uVar33 = local_f0;
          }
          if ((int)uVar33 < (int)_w) {
            lVar29 = 0;
            do {
              *puVar39 = *(undefined4 *)((long)local_c0.data + lVar29 * 4 + lVar36);
              puVar39[1] = *(undefined4 *)((long)local_c0.data + lVar29 * 4 + lVar42);
              puVar39[2] = *(undefined4 *)((long)local_c0.data + lVar29 * 4 + lVar32);
              puVar39[3] = *(undefined4 *)((long)local_c0.data + lVar29 * 4 + lVar28);
              puVar39 = puVar39 + 4;
              lVar29 = lVar29 + 1;
            } while (_w - uVar33 != (int)lVar29);
          }
          uVar38 = uVar37 + 7;
          lVar43 = lVar43 + 4;
          lVar41 = lVar41 + 4;
          local_108 = local_108 + 4;
          local_120 = local_120 + 1;
          uVar37 = uVar37 + 4;
        } while (uVar38 < _h);
      }
      if (local_c0.refcount == (int *)0x0) goto LAB_002e6a57;
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) goto LAB_002e6a57;
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        goto LAB_002e6a57;
      }
    }
    if (local_c0.data != (void *)0x0) {
      free(local_c0.data);
    }
  }
  else {
LAB_002e625b:
    if (p_Var13 != (_func_int *)0xfffffffffffffee0) {
      piVar14 = *(int **)(&this->field_0x138 + (long)p_Var13);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar15 = (this->weight_data_tm).data;
          pAVar16 = (this->weight_data_tm).allocator;
          if (pAVar16 == (Allocator *)0x0) {
            if (pvVar15 != (void *)0x0) {
              free(pvVar15);
            }
          }
          else {
            (*pAVar16->_vptr_Allocator[3])
                      (pAVar16,pvVar15,(long)iVar24 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar14 = *(int **)(&this->field_0x138 + (long)p_Var13);
      (this->weight_data_tm).data = this_01->data;
      (this->weight_data_tm).refcount = piVar14;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var13);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var13);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var13);
      uVar22 = *(undefined8 *)(&this->field_0x158 + (long)p_Var13);
      uVar23 = *(undefined8 *)(&this->field_0x160 + (long)p_Var13);
      (this->weight_data_tm).dims = (int)uVar22;
      (this->weight_data_tm).w = (int)((ulong)uVar22 >> 0x20);
      (this->weight_data_tm).h = (int)uVar23;
      (this->weight_data_tm).d = (int)((ulong)uVar23 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var13);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var13);
    }
  }
LAB_002e6a57:
  if (local_78->lightmode == true) {
    p_Var13 = this->_vptr_InnerProduct_x86_avx[-3];
    piVar14 = *(int **)(&this->field_0x138 + (long)p_Var13);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var13) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var13) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var13));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var13) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var13) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var13) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}